

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O3

void google::protobuf::TestUtil::
     ExpectLastRepeatedExtensionsRemoved<proto2_unittest::TestAllExtensions>
               (TestAllExtensions *message)

{
  internal iVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  MessageLite *pMVar5;
  anon_union_32_1_493b367e_for_TestAllExtensions_3 *this;
  char *pcVar6;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar;
  AssertHelper local_70;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  AssertHelper local_38;
  
  local_68._M_head_impl._0_4_ = 1;
  this = &message->field_0;
  local_70.data_._0_4_ =
       (float)protobuf::internal::ExtensionSet::ExtensionSize
                        (&(this->_impl_)._extensions_,proto2_unittest::repeated_int32_extension);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_58,"1","message.ExtensionSize(Traits::repeated_int32_extension)",
             (int *)&local_68,(int *)&local_70);
  iVar1 = local_58[0];
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar6 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xd96,pcVar6);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  if (iVar1 != (internal)0x0) {
    local_68._M_head_impl._0_4_ = 1;
    local_70.data_._0_4_ =
         (float)protobuf::internal::ExtensionSet::ExtensionSize
                          (&(this->_impl_)._extensions_,proto2_unittest::repeated_int64_extension);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_58,"1","message.ExtensionSize(Traits::repeated_int64_extension)",
               (int *)&local_68,(int *)&local_70);
    iVar1 = local_58[0];
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar6 = (local_50->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd97,pcVar6);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
    if (iVar1 != (internal)0x0) {
      local_68._M_head_impl._0_4_ = 1;
      local_70.data_._0_4_ =
           (float)protobuf::internal::ExtensionSet::ExtensionSize
                            (&(this->_impl_)._extensions_,proto2_unittest::repeated_uint32_extension
                            );
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_58,"1","message.ExtensionSize(Traits::repeated_uint32_extension)"
                 ,(int *)&local_68,(int *)&local_70);
      iVar1 = local_58[0];
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_68);
        if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar6 = (local_50->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                   ,0xd98,pcVar6);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
      }
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_50,local_50);
      }
      if (iVar1 != (internal)0x0) {
        local_68._M_head_impl._0_4_ = 1;
        local_70.data_._0_4_ =
             (float)protobuf::internal::ExtensionSet::ExtensionSize
                              (&(this->_impl_)._extensions_,
                               proto2_unittest::repeated_uint64_extension);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_58,"1",
                   "message.ExtensionSize(Traits::repeated_uint64_extension)",(int *)&local_68,
                   (int *)&local_70);
        iVar1 = local_58[0];
        if (local_58[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_68);
          if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar6 = (local_50->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                     ,0xd99,pcVar6);
          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          if (local_68._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_68._M_head_impl + 8))();
          }
        }
        if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_50,local_50);
        }
        if (iVar1 != (internal)0x0) {
          local_68._M_head_impl._0_4_ = 1;
          local_70.data_._0_4_ =
               (float)protobuf::internal::ExtensionSet::ExtensionSize
                                (&(this->_impl_)._extensions_,
                                 proto2_unittest::repeated_sint32_extension);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_58,"1",
                     "message.ExtensionSize(Traits::repeated_sint32_extension)",(int *)&local_68,
                     (int *)&local_70);
          iVar1 = local_58[0];
          if (local_58[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_68);
            if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar6 = anon_var_dwarf_a22956 + 5;
            }
            else {
              pcVar6 = (local_50->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_70,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                       ,0xd9a,pcVar6);
            testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper(&local_70);
            if (local_68._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_68._M_head_impl + 8))();
            }
          }
          if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_50,local_50);
          }
          if (iVar1 != (internal)0x0) {
            local_68._M_head_impl._0_4_ = 1;
            local_70.data_._0_4_ =
                 (float)protobuf::internal::ExtensionSet::ExtensionSize
                                  (&(this->_impl_)._extensions_,
                                   proto2_unittest::repeated_sint64_extension);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_58,"1",
                       "message.ExtensionSize(Traits::repeated_sint64_extension)",(int *)&local_68,
                       (int *)&local_70);
            iVar1 = local_58[0];
            if (local_58[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_68);
              if (local_50 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar6 = anon_var_dwarf_a22956 + 5;
              }
              else {
                pcVar6 = (local_50->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_70,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                         ,0xd9b,pcVar6);
              testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
              testing::internal::AssertHelper::~AssertHelper(&local_70);
              if (local_68._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_68._M_head_impl + 8))();
              }
            }
            if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_50,local_50);
            }
            if (iVar1 != (internal)0x0) {
              local_68._M_head_impl._0_4_ = 1;
              local_70.data_._0_4_ =
                   (float)protobuf::internal::ExtensionSet::ExtensionSize
                                    (&(this->_impl_)._extensions_,
                                     (int)proto2_unittest::repeated_fixed32_extension);
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_58,"1",
                         "message.ExtensionSize(Traits::repeated_fixed32_extension)",
                         (int *)&local_68,(int *)&local_70);
              iVar1 = local_58[0];
              if (local_58[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_68);
                if (local_50 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar6 = anon_var_dwarf_a22956 + 5;
                }
                else {
                  pcVar6 = (local_50->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_70,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                           ,0xd9c,pcVar6);
                testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
                testing::internal::AssertHelper::~AssertHelper(&local_70);
                if (local_68._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                }
              }
              if (local_50 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_50,local_50);
              }
              if (iVar1 != (internal)0x0) {
                local_68._M_head_impl._0_4_ = 1;
                local_70.data_._0_4_ =
                     (float)protobuf::internal::ExtensionSet::ExtensionSize
                                      (&(this->_impl_)._extensions_,
                                       proto2_unittest::repeated_fixed64_extension);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_58,"1",
                           "message.ExtensionSize(Traits::repeated_fixed64_extension)",
                           (int *)&local_68,(int *)&local_70);
                iVar1 = local_58[0];
                if (local_58[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_68);
                  if (local_50 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar6 = anon_var_dwarf_a22956 + 5;
                  }
                  else {
                    pcVar6 = (local_50->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_70,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                             ,0xd9d,pcVar6);
                  testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
                  testing::internal::AssertHelper::~AssertHelper(&local_70);
                  if (local_68._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_68._M_head_impl + 8))();
                  }
                }
                if (local_50 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_50,local_50);
                }
                if (iVar1 != (internal)0x0) {
                  local_68._M_head_impl._0_4_ = 1;
                  local_70.data_._0_4_ =
                       (float)protobuf::internal::ExtensionSet::ExtensionSize
                                        (&(this->_impl_)._extensions_,
                                         proto2_unittest::repeated_sfixed32_extension);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)local_58,"1",
                             "message.ExtensionSize(Traits::repeated_sfixed32_extension)",
                             (int *)&local_68,(int *)&local_70);
                  iVar1 = local_58[0];
                  if (local_58[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_68);
                    if (local_50 ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar6 = anon_var_dwarf_a22956 + 5;
                    }
                    else {
                      pcVar6 = (local_50->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_70,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                               ,0xd9e,pcVar6);
                    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
                    testing::internal::AssertHelper::~AssertHelper(&local_70);
                    if (local_68._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_68._M_head_impl + 8))();
                    }
                  }
                  if (local_50 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_50,local_50);
                  }
                  if (iVar1 != (internal)0x0) {
                    local_68._M_head_impl._0_4_ = 1;
                    local_70.data_._0_4_ =
                         (float)protobuf::internal::ExtensionSet::ExtensionSize
                                          (&(this->_impl_)._extensions_,
                                           proto2_unittest::repeated_sfixed64_extension);
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)local_58,"1",
                               "message.ExtensionSize(Traits::repeated_sfixed64_extension)",
                               (int *)&local_68,(int *)&local_70);
                    iVar1 = local_58[0];
                    if (local_58[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&local_68);
                      if (local_50 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar6 = anon_var_dwarf_a22956 + 5;
                      }
                      else {
                        pcVar6 = (local_50->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_70,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                 ,0xd9f,pcVar6);
                      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
                      testing::internal::AssertHelper::~AssertHelper(&local_70);
                      if (local_68._M_head_impl !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        (**(code **)(*(long *)local_68._M_head_impl + 8))();
                      }
                    }
                    if (local_50 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_50,local_50);
                    }
                    if (iVar1 != (internal)0x0) {
                      local_68._M_head_impl._0_4_ = 1;
                      local_70.data_._0_4_ =
                           (float)protobuf::internal::ExtensionSet::ExtensionSize
                                            (&(this->_impl_)._extensions_,
                                             (int)proto2_unittest::repeated_float_extension);
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)local_58,"1",
                                 "message.ExtensionSize(Traits::repeated_float_extension)",
                                 (int *)&local_68,(int *)&local_70);
                      iVar1 = local_58[0];
                      if (local_58[0] == (internal)0x0) {
                        testing::Message::Message((Message *)&local_68);
                        if (local_50 ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar6 = anon_var_dwarf_a22956 + 5;
                        }
                        else {
                          pcVar6 = (local_50->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_70,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                   ,0xda0,pcVar6);
                        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
                        testing::internal::AssertHelper::~AssertHelper(&local_70);
                        if (local_68._M_head_impl !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) {
                          (**(code **)(*(long *)local_68._M_head_impl + 8))();
                        }
                      }
                      if (local_50 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_50,local_50);
                      }
                      if (iVar1 != (internal)0x0) {
                        local_68._M_head_impl._0_4_ = 1;
                        local_70.data_._0_4_ =
                             (float)protobuf::internal::ExtensionSet::ExtensionSize
                                              (&(this->_impl_)._extensions_,
                                               proto2_unittest::repeated_double_extension);
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)local_58,"1",
                                   "message.ExtensionSize(Traits::repeated_double_extension)",
                                   (int *)&local_68,(int *)&local_70);
                        iVar1 = local_58[0];
                        if (local_58[0] == (internal)0x0) {
                          testing::Message::Message((Message *)&local_68);
                          if (local_50 ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar6 = anon_var_dwarf_a22956 + 5;
                          }
                          else {
                            pcVar6 = (local_50->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_70,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                     ,0xda1,pcVar6);
                          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68)
                          ;
                          testing::internal::AssertHelper::~AssertHelper(&local_70);
                          if (local_68._M_head_impl !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0) {
                            (**(code **)(*(long *)local_68._M_head_impl + 8))();
                          }
                        }
                        if (local_50 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_50,local_50);
                        }
                        if (iVar1 != (internal)0x0) {
                          local_68._M_head_impl._0_4_ = 1;
                          local_70.data_._0_4_ =
                               (float)protobuf::internal::ExtensionSet::ExtensionSize
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::repeated_bool_extension);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)local_58,"1",
                                     "message.ExtensionSize(Traits::repeated_bool_extension)",
                                     (int *)&local_68,(int *)&local_70);
                          iVar1 = local_58[0];
                          if (local_58[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_68);
                            if (local_50 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar6 = anon_var_dwarf_a22956 + 5;
                            }
                            else {
                              pcVar6 = (local_50->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_70,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                       ,0xda2,pcVar6);
                            testing::internal::AssertHelper::operator=
                                      (&local_70,(Message *)&local_68);
                            testing::internal::AssertHelper::~AssertHelper(&local_70);
                            if (local_68._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_68._M_head_impl + 8))();
                            }
                          }
                          if (local_50 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_50,local_50);
                          }
                          if (iVar1 != (internal)0x0) {
                            local_68._M_head_impl._0_4_ = 1;
                            local_70.data_._0_4_ =
                                 (float)protobuf::internal::ExtensionSet::ExtensionSize
                                                  (&(this->_impl_)._extensions_,
                                                   proto2_unittest::repeated_string_extension);
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)local_58,"1",
                                       "message.ExtensionSize(Traits::repeated_string_extension)",
                                       (int *)&local_68,(int *)&local_70);
                            iVar1 = local_58[0];
                            if (local_58[0] == (internal)0x0) {
                              testing::Message::Message((Message *)&local_68);
                              if (local_50 ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar6 = anon_var_dwarf_a22956 + 5;
                              }
                              else {
                                pcVar6 = (local_50->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_70,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                         ,0xda3,pcVar6);
                              testing::internal::AssertHelper::operator=
                                        (&local_70,(Message *)&local_68);
                              testing::internal::AssertHelper::~AssertHelper(&local_70);
                              if (local_68._M_head_impl !=
                                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                (**(code **)(*(long *)local_68._M_head_impl + 8))();
                              }
                            }
                            if (local_50 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_50,local_50);
                            }
                            if (iVar1 != (internal)0x0) {
                              local_68._M_head_impl._0_4_ = 1;
                              local_70.data_._0_4_ =
                                   (float)protobuf::internal::ExtensionSet::ExtensionSize
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::repeated_bytes_extension);
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)local_58,"1",
                                         "message.ExtensionSize(Traits::repeated_bytes_extension)",
                                         (int *)&local_68,(int *)&local_70);
                              iVar1 = local_58[0];
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar6 = anon_var_dwarf_a22956 + 5;
                                }
                                else {
                                  pcVar6 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xda4,pcVar6);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              if (iVar1 != (internal)0x0) {
                                local_68._M_head_impl._0_4_ = 1;
                                local_70.data_._0_4_ =
                                     (float)protobuf::internal::ExtensionSet::ExtensionSize
                                                      (&(this->_impl_)._extensions_,
                                                       proto2_unittest::repeatedgroup_extension);
                                testing::internal::CmpHelperEQ<int,int>
                                          ((internal *)local_58,"1",
                                           "message.ExtensionSize(Traits::repeatedgroup_extension)",
                                           (int *)&local_68,(int *)&local_70);
                                iVar1 = local_58[0];
                                if (local_58[0] == (internal)0x0) {
                                  testing::Message::Message((Message *)&local_68);
                                  if (local_50 ==
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                  }
                                  else {
                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_70,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                             ,0xda6,pcVar6);
                                  testing::internal::AssertHelper::operator=
                                            (&local_70,(Message *)&local_68);
                                  testing::internal::AssertHelper::~AssertHelper(&local_70);
                                  if (local_68._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                  }
                                }
                                if (local_50 !=
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&local_50,local_50);
                                }
                                if (iVar1 != (internal)0x0) {
                                  local_68._M_head_impl._0_4_ = 1;
                                  local_70.data_._0_4_ =
                                       (float)protobuf::internal::ExtensionSet::ExtensionSize
                                                        (&(this->_impl_)._extensions_,
                                                         proto2_unittest::
                                                         repeated_nested_message_extension);
                                  testing::internal::CmpHelperEQ<int,int>
                                            ((internal *)local_58,"1",
                                             "message.ExtensionSize(Traits::repeated_nested_message_extension)"
                                             ,(int *)&local_68,(int *)&local_70);
                                  iVar1 = local_58[0];
                                  if (local_58[0] == (internal)0x0) {
                                    testing::Message::Message((Message *)&local_68);
                                    if (local_50 ==
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      pcVar6 = anon_var_dwarf_a22956 + 5;
                                    }
                                    else {
                                      pcVar6 = (local_50->_M_dataplus)._M_p;
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_70,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                               ,0xda8,pcVar6);
                                    testing::internal::AssertHelper::operator=
                                              (&local_70,(Message *)&local_68);
                                    testing::internal::AssertHelper::~AssertHelper(&local_70);
                                    if (local_68._M_head_impl !=
                                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                    }
                                  }
                                  if (local_50 !=
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    std::
                                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                  }
                                  if (iVar1 != (internal)0x0) {
                                    local_68._M_head_impl._0_4_ = 1;
                                    local_70.data_._0_4_ =
                                         (float)protobuf::internal::ExtensionSet::ExtensionSize
                                                          (&(this->_impl_)._extensions_,
                                                           proto2_unittest::
                                                           repeated_foreign_message_extension);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_58,"1",
                                               "message.ExtensionSize(Traits::repeated_foreign_message_extension)"
                                               ,(int *)&local_68,(int *)&local_70);
                                    iVar1 = local_58[0];
                                    if (local_58[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)&local_68);
                                      if (local_50 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar6 = anon_var_dwarf_a22956 + 5;
                                      }
                                      else {
                                        pcVar6 = (local_50->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_70,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                 ,0xdaa,pcVar6);
                                      testing::internal::AssertHelper::operator=
                                                (&local_70,(Message *)&local_68);
                                      testing::internal::AssertHelper::~AssertHelper(&local_70);
                                      if (local_68._M_head_impl !=
                                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                      }
                                    }
                                    if (local_50 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                    }
                                    if (iVar1 != (internal)0x0) {
                                      local_68._M_head_impl._0_4_ = 1;
                                      local_70.data_._0_4_ =
                                           (float)protobuf::internal::ExtensionSet::ExtensionSize
                                                            (&(this->_impl_)._extensions_,
                                                             proto2_unittest::
                                                             repeated_import_message_extension);
                                      testing::internal::CmpHelperEQ<int,int>
                                                ((internal *)local_58,"1",
                                                 "message.ExtensionSize(Traits::repeated_import_message_extension)"
                                                 ,(int *)&local_68,(int *)&local_70);
                                      iVar1 = local_58[0];
                                      if (local_58[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)&local_68);
                                        if (local_50 ==
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x0) {
                                          pcVar6 = anon_var_dwarf_a22956 + 5;
                                        }
                                        else {
                                          pcVar6 = (local_50->_M_dataplus)._M_p;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_70,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdac,pcVar6);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_70,(Message *)&local_68);
                                        testing::internal::AssertHelper::~AssertHelper(&local_70);
                                        if (local_68._M_head_impl !=
                                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x0) {
                                          (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                        }
                                      }
                                      if (local_50 !=
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                      }
                                      if (iVar1 != (internal)0x0) {
                                        local_68._M_head_impl._0_4_ = 1;
                                        local_70.data_._0_4_ =
                                             (float)protobuf::internal::ExtensionSet::ExtensionSize
                                                              (&(this->_impl_)._extensions_,
                                                               proto2_unittest::
                                                               repeated_lazy_message_extension);
                                        testing::internal::CmpHelperEQ<int,int>
                                                  ((internal *)local_58,"1",
                                                                                                      
                                                  "message.ExtensionSize(Traits::repeated_lazy_message_extension)"
                                                  ,(int *)&local_68,(int *)&local_70);
                                        iVar1 = local_58[0];
                                        if (local_58[0] == (internal)0x0) {
                                          testing::Message::Message((Message *)&local_68);
                                          if (local_50 ==
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)0x0) {
                                            pcVar6 = anon_var_dwarf_a22956 + 5;
                                          }
                                          else {
                                            pcVar6 = (local_50->_M_dataplus)._M_p;
                                          }
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_70,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdad,pcVar6);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_70,(Message *)&local_68);
                                          testing::internal::AssertHelper::~AssertHelper(&local_70);
                                          if (local_68._M_head_impl !=
                                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)0x0) {
                                            (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                          }
                                        }
                                        if (local_50 !=
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x0) {
                                          std::
                                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                        }
                                        if (iVar1 != (internal)0x0) {
                                          local_68._M_head_impl._0_4_ = 1;
                                          local_70.data_._0_4_ =
                                               (float)protobuf::internal::ExtensionSet::
                                                      ExtensionSize(&(this->_impl_)._extensions_,
                                                                    proto2_unittest::
                                                                    repeated_nested_enum_extension);
                                          testing::internal::CmpHelperEQ<int,int>
                                                    ((internal *)local_58,"1",
                                                                                                          
                                                  "message.ExtensionSize(Traits::repeated_nested_enum_extension)"
                                                  ,(int *)&local_68,(int *)&local_70);
                                          iVar1 = local_58[0];
                                          if (local_58[0] == (internal)0x0) {
                                            testing::Message::Message((Message *)&local_68);
                                            if (local_50 ==
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)0x0) {
                                              pcVar6 = anon_var_dwarf_a22956 + 5;
                                            }
                                            else {
                                              pcVar6 = (local_50->_M_dataplus)._M_p;
                                            }
                                            testing::internal::AssertHelper::AssertHelper
                                                      (&local_70,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdae,pcVar6);
                                            testing::internal::AssertHelper::operator=
                                                      (&local_70,(Message *)&local_68);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      (&local_70);
                                            if (local_68._M_head_impl !=
                                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)0x0) {
                                              (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                            }
                                          }
                                          if (local_50 !=
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)0x0) {
                                            std::
                                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                          }
                                          if (iVar1 != (internal)0x0) {
                                            local_68._M_head_impl._0_4_ = 1;
                                            local_70.data_._0_4_ =
                                                 (float)protobuf::internal::ExtensionSet::
                                                        ExtensionSize(&(this->_impl_)._extensions_,
                                                                      proto2_unittest::
                                                                                                                                            
                                                  repeated_foreign_enum_extension);
                                            testing::internal::CmpHelperEQ<int,int>
                                                      ((internal *)local_58,"1",
                                                                                                              
                                                  "message.ExtensionSize(Traits::repeated_foreign_enum_extension)"
                                                  ,(int *)&local_68,(int *)&local_70);
                                            iVar1 = local_58[0];
                                            if (local_58[0] == (internal)0x0) {
                                              testing::Message::Message((Message *)&local_68);
                                              if (local_50 ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                pcVar6 = anon_var_dwarf_a22956 + 5;
                                              }
                                              else {
                                                pcVar6 = (local_50->_M_dataplus)._M_p;
                                              }
                                              testing::internal::AssertHelper::AssertHelper
                                                        (&local_70,kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdaf,pcVar6);
                                              testing::internal::AssertHelper::operator=
                                                        (&local_70,(Message *)&local_68);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        (&local_70);
                                              if (local_68._M_head_impl !=
                                                  (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                              }
                                            }
                                            if (local_50 !=
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)0x0) {
                                              std::
                                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                            }
                                            if (iVar1 != (internal)0x0) {
                                              local_68._M_head_impl._0_4_ = 1;
                                              local_70.data_._0_4_ =
                                                   (float)protobuf::internal::ExtensionSet::
                                                          ExtensionSize(&(this->_impl_)._extensions_
                                                                        ,proto2_unittest::
                                                                                                                                                  
                                                  repeated_import_enum_extension);
                                              testing::internal::CmpHelperEQ<int,int>
                                                        ((internal *)local_58,"1",
                                                                                                                  
                                                  "message.ExtensionSize(Traits::repeated_import_enum_extension)"
                                                  ,(int *)&local_68,(int *)&local_70);
                                              iVar1 = local_58[0];
                                              if (local_58[0] == (internal)0x0) {
                                                testing::Message::Message((Message *)&local_68);
                                                if (local_50 ==
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  pcVar6 = anon_var_dwarf_a22956 + 5;
                                                }
                                                else {
                                                  pcVar6 = (local_50->_M_dataplus)._M_p;
                                                }
                                                testing::internal::AssertHelper::AssertHelper
                                                          (&local_70,kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdb0,pcVar6);
                                                testing::internal::AssertHelper::operator=
                                                          (&local_70,(Message *)&local_68);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          (&local_70);
                                                if (local_68._M_head_impl !=
                                                    (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  (**(code **)(*(long *)local_68._M_head_impl + 8))
                                                            ();
                                                }
                                              }
                                              if (local_50 !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                std::
                                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                              }
                                              if (iVar1 != (internal)0x0) {
                                                local_68._M_head_impl._0_4_ = 1;
                                                local_70.data_._0_4_ =
                                                     (float)protobuf::internal::ExtensionSet::
                                                            ExtensionSize(&(this->_impl_).
                                                                           _extensions_,
                                                                          proto2_unittest::
                                                                                                                                                    
                                                  repeated_string_piece_extension);
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_58,"1",
                                                                                                                      
                                                  "message.ExtensionSize(Traits::repeated_string_piece_extension)"
                                                  ,(int *)&local_68,(int *)&local_70);
                                                iVar1 = local_58[0];
                                                if (local_58[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_68);
                                                  if (local_50 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdb2,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                }
                                                if (local_50 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                }
                                                if (iVar1 != (internal)0x0) {
                                                  local_68._M_head_impl._0_4_ = 1;
                                                  local_70.data_._0_4_ =
                                                       (float)protobuf::internal::ExtensionSet::
                                                              ExtensionSize(&(this->_impl_).
                                                                             _extensions_,
                                                                            proto2_unittest::
                                                                            repeated_cord_extension)
                                                  ;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_58,"1",
                                                                                                                          
                                                  "message.ExtensionSize(Traits::repeated_cord_extension)"
                                                  ,(int *)&local_68,(int *)&local_70);
                                                  iVar1 = local_58[0];
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdb3,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  if (iVar1 != (internal)0x0) {
                                                    local_68._M_head_impl._0_4_ = 0xc9;
                                                    local_70.data_._0_4_ =
                                                         (float)protobuf::internal::ExtensionSet::
                                                                GetRepeatedInt32(&(this->_impl_).
                                                                                  _extensions_,
                                                                                 proto2_unittest::
                                                                                                                                                                  
                                                  repeated_int32_extension,0);
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_58,"201",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_int32_extension, 0)"
                                                  ,(int *)&local_68,(int *)&local_70);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdb6,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  local_70.data_._0_4_ = 2.83062e-43;
                                                  local_68._M_head_impl =
                                                       (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)protobuf::internal::ExtensionSet::
                                                    GetRepeatedInt64(&(this->_impl_)._extensions_,
                                                                     proto2_unittest::
                                                                     repeated_int64_extension,0);
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_58,"202",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_int64_extension, 0)"
                                                  ,(int *)&local_70,(long *)&local_68);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdb7,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  local_68._M_head_impl._0_4_ = 0xcb;
                                                  local_70.data_._0_4_ =
                                                       (float)protobuf::internal::ExtensionSet::
                                                              GetRepeatedUInt32(&(this->_impl_).
                                                                                 _extensions_,
                                                                                proto2_unittest::
                                                                                                                                                                
                                                  repeated_uint32_extension,0);
                                                  testing::internal::CmpHelperEQ<int,unsigned_int>
                                                            ((internal *)local_58,"203",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_uint32_extension, 0)"
                                                  ,(int *)&local_68,(uint *)&local_70);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdb8,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  local_70.data_._0_4_ = 2.85865e-43;
                                                  local_68._M_head_impl =
                                                       (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)protobuf::internal::ExtensionSet::
                                                    GetRepeatedUInt64(&(this->_impl_)._extensions_,
                                                                      proto2_unittest::
                                                                      repeated_uint64_extension,0);
                                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                                            ((internal *)local_58,"204",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_uint64_extension, 0)"
                                                  ,(int *)&local_70,(unsigned_long *)&local_68);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdb9,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  local_68._M_head_impl._0_4_ = 0xcd;
                                                  local_70.data_._0_4_ =
                                                       (float)protobuf::internal::ExtensionSet::
                                                              GetRepeatedInt32(&(this->_impl_).
                                                                                _extensions_,
                                                                               proto2_unittest::
                                                                                                                                                              
                                                  repeated_sint32_extension,0);
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_58,"205",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_sint32_extension, 0)"
                                                  ,(int *)&local_68,(int *)&local_70);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdba,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  local_70.data_._0_4_ = 2.88667e-43;
                                                  local_68._M_head_impl =
                                                       (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)protobuf::internal::ExtensionSet::
                                                    GetRepeatedInt64(&(this->_impl_)._extensions_,
                                                                     proto2_unittest::
                                                                     repeated_sint64_extension,0);
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_58,"206",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_sint64_extension, 0)"
                                                  ,(int *)&local_70,(long *)&local_68);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdbb,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  local_68._M_head_impl._0_4_ = 0xcf;
                                                  local_70.data_._0_4_ =
                                                       (float)protobuf::internal::ExtensionSet::
                                                              GetRepeatedUInt32(&(this->_impl_).
                                                                                 _extensions_,
                                                                                (int)proto2_unittest
                                                                                     ::
                                                  repeated_fixed32_extension,0);
                                                  testing::internal::CmpHelperEQ<int,unsigned_int>
                                                            ((internal *)local_58,"207",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_fixed32_extension, 0)"
                                                  ,(int *)&local_68,(uint *)&local_70);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdbc,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  local_70.data_._0_4_ = 2.9147e-43;
                                                  local_68._M_head_impl =
                                                       (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)protobuf::internal::ExtensionSet::
                                                    GetRepeatedUInt64(&(this->_impl_)._extensions_,
                                                                      proto2_unittest::
                                                                      repeated_fixed64_extension,0);
                                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                                            ((internal *)local_58,"208",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_fixed64_extension, 0)"
                                                  ,(int *)&local_70,(unsigned_long *)&local_68);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdbd,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  local_68._M_head_impl._0_4_ = 0xd1;
                                                  local_70.data_._0_4_ =
                                                       (float)protobuf::internal::ExtensionSet::
                                                              GetRepeatedInt32(&(this->_impl_).
                                                                                _extensions_,
                                                                               proto2_unittest::
                                                                                                                                                              
                                                  repeated_sfixed32_extension,0);
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_58,"209",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_sfixed32_extension, 0)"
                                                  ,(int *)&local_68,(int *)&local_70);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdbe,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  local_70.data_._0_4_ = 2.94273e-43;
                                                  local_68._M_head_impl =
                                                       (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)protobuf::internal::ExtensionSet::
                                                    GetRepeatedInt64(&(this->_impl_)._extensions_,
                                                                     proto2_unittest::
                                                                     repeated_sfixed64_extension,0);
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_58,"210",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_sfixed64_extension, 0)"
                                                  ,(int *)&local_70,(long *)&local_68);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdbf,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  local_68._M_head_impl._0_4_ = 0xd3;
                                                  local_70.data_._0_4_ =
                                                       protobuf::internal::ExtensionSet::
                                                       GetRepeatedFloat(&(this->_impl_)._extensions_
                                                                        ,(int)proto2_unittest::
                                                                                                                                                            
                                                  repeated_float_extension,0);
                                                  testing::internal::CmpHelperEQ<int,float>
                                                            ((internal *)local_58,"211",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_float_extension, 0)"
                                                  ,(int *)&local_68,(float *)&local_70);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdc0,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  local_70.data_._0_4_ = 2.97075e-43;
                                                  local_68._M_head_impl =
                                                       (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)protobuf::internal::ExtensionSet::
                                                    GetRepeatedDouble(&(this->_impl_)._extensions_,
                                                                      proto2_unittest::
                                                                      repeated_double_extension,0);
                                                  testing::internal::CmpHelperEQ<int,double>
                                                            ((internal *)local_58,"212",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_double_extension, 0)"
                                                  ,(int *)&local_70,(double *)&local_68);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdc1,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  bVar2 = protobuf::internal::ExtensionSet::
                                                          GetRepeatedBool(&(this->_impl_).
                                                                           _extensions_,
                                                                          proto2_unittest::
                                                                          repeated_bool_extension,0)
                                                  ;
                                                  local_68._M_head_impl._0_1_ = bVar2;
                                                  local_60 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (!bVar2) {
                                                    testing::Message::Message((Message *)&local_70);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_58,
                                                               (internal *)&local_68,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "message.GetExtension(Traits::repeated_bool_extension, 0)"
                                                  ,"false","true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdc2,(char *)CONCAT71(local_58._1_7_,local_58[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,(Message *)&local_70);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_58._1_7_,local_58[0]) !=
                                                  &local_48) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_58._1_7_,local_58[0]),
                                                  local_48._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_70.data_._4_4_,
                                                                       local_70.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_70.data_.
                                                                                   _4_4_,local_70.
                                                  data_._0_4_) + 8))();
                                                  }
                                                  if (local_60 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_60,local_60);
                                                  }
                                                  }
                                                  psVar4 = protobuf::internal::ExtensionSet::
                                                           GetRepeatedString_abi_cxx11_
                                                                     (&(this->_impl_)._extensions_,
                                                                      proto2_unittest::
                                                                      repeated_string_extension,0);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)local_58,"\"215\"",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_string_extension, 0)"
                                                  ,(char (*) [4])"215",psVar4);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdc3,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  psVar4 = protobuf::internal::ExtensionSet::
                                                           GetRepeatedString_abi_cxx11_
                                                                     (&(this->_impl_)._extensions_,
                                                                      proto2_unittest::
                                                                      repeated_bytes_extension,0);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)local_58,"\"216\"",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_bytes_extension, 0)"
                                                  ,(char (*) [4])"216",psVar4);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdc4,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  local_68._M_head_impl._0_4_ = 0xd9;
                                                  pMVar5 = protobuf::internal::ExtensionSet::
                                                           GetRepeatedMessage(&(this->_impl_).
                                                                               _extensions_,
                                                                              proto2_unittest::
                                                                                                                                                            
                                                  repeatedgroup_extension,0);
                                                  local_70.data_._0_4_ =
                                                       (float)pMVar5[1]._internal_metadata_.ptr_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_58,"217",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeatedgroup_extension, 0).a()"
                                                  ,(int *)&local_68,(int *)&local_70);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdc6,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  local_68._M_head_impl._0_4_ = 0xda;
                                                  pMVar5 = protobuf::internal::ExtensionSet::
                                                           GetRepeatedMessage(&(this->_impl_).
                                                                               _extensions_,
                                                                              proto2_unittest::
                                                                                                                                                            
                                                  repeated_nested_message_extension,0);
                                                  local_70.data_._0_4_ =
                                                       (float)pMVar5[1]._internal_metadata_.ptr_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_58,"218",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_nested_message_extension, 0).bb()"
                                                  ,(int *)&local_68,(int *)&local_70);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdc9,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  local_68._M_head_impl._0_4_ = 0xdb;
                                                  pMVar5 = protobuf::internal::ExtensionSet::
                                                           GetRepeatedMessage(&(this->_impl_).
                                                                               _extensions_,
                                                                              proto2_unittest::
                                                                                                                                                            
                                                  repeated_foreign_message_extension,0);
                                                  local_70.data_._0_4_ =
                                                       (float)pMVar5[1]._internal_metadata_.ptr_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_58,"219",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_foreign_message_extension, 0).c()"
                                                  ,(int *)&local_68,(int *)&local_70);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdcc,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  local_68._M_head_impl._0_4_ = 0xdc;
                                                  pMVar5 = protobuf::internal::ExtensionSet::
                                                           GetRepeatedMessage(&(this->_impl_).
                                                                               _extensions_,
                                                                              proto2_unittest::
                                                                                                                                                            
                                                  repeated_import_message_extension,0);
                                                  local_70.data_._0_4_ =
                                                       (float)pMVar5[1]._internal_metadata_.ptr_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_58,"220",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_import_message_extension, 0).d()"
                                                  ,(int *)&local_68,(int *)&local_70);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdcf,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  local_68._M_head_impl._0_4_ = 0xe3;
                                                  pMVar5 = protobuf::internal::ExtensionSet::
                                                           GetRepeatedMessage(&(this->_impl_).
                                                                               _extensions_,
                                                                              proto2_unittest::
                                                                                                                                                            
                                                  repeated_lazy_message_extension,0);
                                                  local_70.data_._0_4_ =
                                                       (float)pMVar5[1]._internal_metadata_.ptr_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_58,"227",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_lazy_message_extension, 0).bb()"
                                                  ,(int *)&local_68,(int *)&local_70);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdd2,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  iVar3 = protobuf::internal::ExtensionSet::
                                                          GetRepeatedEnum(&(this->_impl_).
                                                                           _extensions_,
                                                                          proto2_unittest::
                                                                                                                                                    
                                                  repeated_nested_enum_extension,0);
                                                  local_68._M_head_impl._0_4_ = iVar3;
                                                  testing::internal::
                                                  CmpHelperEQ<proto2_unittest::TestAllTypes_NestedEnum,proto2_unittest::TestAllTypes_NestedEnum>
                                                            ((internal *)local_58,
                                                             "Traits::TestAllTypes::BAR",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_nested_enum_extension, 0)"
                                                  ,&proto2_unittest::TestAllTypes::BAR,
                                                  (TestAllTypes_NestedEnum *)&local_68);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdd5,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  iVar3 = protobuf::internal::ExtensionSet::
                                                          GetRepeatedEnum(&(this->_impl_).
                                                                           _extensions_,
                                                                          proto2_unittest::
                                                                                                                                                    
                                                  repeated_foreign_enum_extension,0);
                                                  local_68._M_head_impl._0_4_ = iVar3;
                                                  testing::internal::
                                                  CmpHelperEQ<proto2_unittest::ForeignEnum,proto2_unittest::ForeignEnum>
                                                            ((internal *)local_58,
                                                             "Traits::FOREIGN_BAR",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_foreign_enum_extension, 0)"
                                                  ,&
                                                  TestUtilTraits<proto2_unittest::TestAllExtensions>
                                                  ::FOREIGN_BAR,(ForeignEnum *)&local_68);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdd7,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  iVar3 = protobuf::internal::ExtensionSet::
                                                          GetRepeatedEnum(&(this->_impl_).
                                                                           _extensions_,
                                                                          proto2_unittest::
                                                                                                                                                    
                                                  repeated_import_enum_extension,0);
                                                  local_68._M_head_impl._0_4_ = iVar3;
                                                  testing::internal::
                                                  CmpHelperEQ<proto2_unittest_import::ImportEnum,proto2_unittest_import::ImportEnum>
                                                            ((internal *)local_58,
                                                             "Traits::IMPORT_BAR",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_import_enum_extension, 0)"
                                                  ,&
                                                  TestUtilTraits<proto2_unittest::TestAllExtensions>
                                                  ::IMPORT_BAR,(ImportEnum *)&local_68);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xdd9,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  psVar4 = protobuf::internal::ExtensionSet::
                                                           GetRepeatedString_abi_cxx11_
                                                                     (&(this->_impl_)._extensions_,
                                                                      proto2_unittest::
                                                                                                                                            
                                                  repeated_string_piece_extension,0);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)local_58,"\"224\"",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_string_piece_extension, 0)"
                                                  ,(char (*) [4])"224",psVar4);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xddc,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  psVar4 = protobuf::internal::ExtensionSet::
                                                           GetRepeatedString_abi_cxx11_
                                                                     (&(this->_impl_)._extensions_,
                                                                      proto2_unittest::
                                                                      repeated_cord_extension,0);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)local_58,"\"225\"",
                                                                                                                          
                                                  "message.GetExtension(Traits::repeated_cord_extension, 0)"
                                                  ,(char (*) [4])"225",psVar4);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_68);
                                                    if (local_50 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar6 = anon_var_dwarf_a22956 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = (local_50->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0xddd,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_70,(Message *)&local_68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_70);
                                                  if (local_68._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_68._M_head_impl + 8)
                                                    )();
                                                  }
                                                  }
                                                  if (local_50 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_50,local_50);
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ExpectLastRepeatedExtensionsRemoved(const TestAllExtensions& message) {
  using Traits = TestUtilTraits<TestAllExtensions>;
  // Test that one element was removed.
  ASSERT_EQ(1, message.ExtensionSize(Traits::repeated_int32_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::repeated_int64_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::repeated_uint32_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::repeated_uint64_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::repeated_sint32_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::repeated_sint64_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::repeated_fixed32_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::repeated_fixed64_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::repeated_sfixed32_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::repeated_sfixed64_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::repeated_float_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::repeated_double_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::repeated_bool_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::repeated_string_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::repeated_bytes_extension));

  ASSERT_EQ(1, message.ExtensionSize(Traits::repeatedgroup_extension));
  ASSERT_EQ(1,
            message.ExtensionSize(Traits::repeated_nested_message_extension));
  ASSERT_EQ(1,
            message.ExtensionSize(Traits::repeated_foreign_message_extension));
  ASSERT_EQ(1,
            message.ExtensionSize(Traits::repeated_import_message_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::repeated_lazy_message_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::repeated_nested_enum_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::repeated_foreign_enum_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::repeated_import_enum_extension));

  ASSERT_EQ(1, message.ExtensionSize(Traits::repeated_string_piece_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::repeated_cord_extension));

  // Test that the remaining element is the correct one.
  EXPECT_EQ(201, message.GetExtension(Traits::repeated_int32_extension, 0));
  EXPECT_EQ(202, message.GetExtension(Traits::repeated_int64_extension, 0));
  EXPECT_EQ(203, message.GetExtension(Traits::repeated_uint32_extension, 0));
  EXPECT_EQ(204, message.GetExtension(Traits::repeated_uint64_extension, 0));
  EXPECT_EQ(205, message.GetExtension(Traits::repeated_sint32_extension, 0));
  EXPECT_EQ(206, message.GetExtension(Traits::repeated_sint64_extension, 0));
  EXPECT_EQ(207, message.GetExtension(Traits::repeated_fixed32_extension, 0));
  EXPECT_EQ(208, message.GetExtension(Traits::repeated_fixed64_extension, 0));
  EXPECT_EQ(209, message.GetExtension(Traits::repeated_sfixed32_extension, 0));
  EXPECT_EQ(210, message.GetExtension(Traits::repeated_sfixed64_extension, 0));
  EXPECT_EQ(211, message.GetExtension(Traits::repeated_float_extension, 0));
  EXPECT_EQ(212, message.GetExtension(Traits::repeated_double_extension, 0));
  EXPECT_TRUE(message.GetExtension(Traits::repeated_bool_extension, 0));
  EXPECT_EQ("215", message.GetExtension(Traits::repeated_string_extension, 0));
  EXPECT_EQ("216", message.GetExtension(Traits::repeated_bytes_extension, 0));

  EXPECT_EQ(217, message.GetExtension(Traits::repeatedgroup_extension, 0).a());
  EXPECT_EQ(
      218,
      message.GetExtension(Traits::repeated_nested_message_extension, 0).bb());
  EXPECT_EQ(
      219,
      message.GetExtension(Traits::repeated_foreign_message_extension, 0).c());
  EXPECT_EQ(
      220,
      message.GetExtension(Traits::repeated_import_message_extension, 0).d());
  EXPECT_EQ(
      227,
      message.GetExtension(Traits::repeated_lazy_message_extension, 0).bb());

  EXPECT_EQ(Traits::TestAllTypes::BAR,
            message.GetExtension(Traits::repeated_nested_enum_extension, 0));
  EXPECT_EQ(Traits::FOREIGN_BAR,
            message.GetExtension(Traits::repeated_foreign_enum_extension, 0));
  EXPECT_EQ(Traits::IMPORT_BAR,
            message.GetExtension(Traits::repeated_import_enum_extension, 0));

  EXPECT_EQ("224",
            message.GetExtension(Traits::repeated_string_piece_extension, 0));
  EXPECT_EQ("225", message.GetExtension(Traits::repeated_cord_extension, 0));
}